

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

double __thiscall
helics::DelayFilterOperation::getProperty(DelayFilterOperation *this,string_view property)

{
  long lVar1;
  bool bVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  
  __y._M_str = "delay";
  __y._M_len = 5;
  bVar2 = std::operator==(property,__y);
  if (bVar2) {
    lVar1 = (this->delay)._M_i.internalTimeCode;
    return (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
  }
  return -1e+49;
}

Assistant:

double DelayFilterOperation::getProperty(std::string_view property)
{
    if (property == "delay") {
        return static_cast<double>(delay.load());
    }
    return FilterOperations::getProperty(property);
}